

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::value::TryGetTypeName_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,value *this,uint32_t tyid)

{
  bool bVar1;
  value_type *pvVar2;
  char *pcVar3;
  allocator local_3e1;
  undefined1 local_3e0 [8];
  string s;
  iterator<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>_> local_3b8;
  const_iterator ret;
  uint32_t scalar_tid;
  bool array_bit;
  map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_57UL> tynamemap;
  uint32_t tyid_local;
  
  tynamemap.data_[0x38].pair.second.data_._4_4_ = (uint)this;
  memcpy(&scalar_tid,&DAT_00ca3068,0x390);
  ret.pos._7_1_ = (tynamemap.data_[0x38].pair.second.data_._4_4_ & 0x100000) != 0;
  ret.pos._0_4_ = tynamemap.data_[0x38].pair.second.data_._4_4_ & 0xffefffff;
  local_3b8.pos =
       (element<unsigned_int,_mapbox::eternal::string> *)
       mapbox::eternal::impl::
       map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_57UL>::find
                 ((map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_57UL>
                   *)&scalar_tid,(key_type *)&ret);
  s.field_2._8_8_ =
       mapbox::eternal::impl::
       map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_57UL>::end
                 ((map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_57UL>
                   *)&scalar_tid);
  bVar1 = mapbox::eternal::
          iterator<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>_>::
          operator!=(&local_3b8,
                     (iterator<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>_>
                      *)((long)&s.field_2 + 8));
  if (bVar1) {
    pvVar2 = mapbox::eternal::
             iterator<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>_>::
             operator->(&local_3b8);
    pcVar3 = mapbox::eternal::string::c_str(&pvVar2->second);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_3e0,pcVar3,&local_3e1);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    if ((ret.pos._7_1_ & 1) != 0) {
      ::std::__cxx11::string::operator+=((string *)local_3e0,"[]");
    }
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0);
    ::std::__cxx11::string::~string((string *)local_3e0);
  }
  else {
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<std::string> TryGetTypeName(uint32_t tyid) {
  MAPBOX_ETERNAL_CONSTEXPR const auto tynamemap =
      mapbox::eternal::map<uint32_t, mapbox::eternal::string>({
          {TYPE_ID_TOKEN, kToken},
          {TYPE_ID_STRING, kString},
          {TYPE_ID_STRING, kPath},
          {TYPE_ID_ASSET_PATH, kAssetPath},
          {TYPE_ID_DICT, kDictionary},
          {TYPE_ID_TIMECODE, kTimeCode},
          {TYPE_ID_BOOL, kBool},
          {TYPE_ID_UCHAR, kUChar},
          {TYPE_ID_HALF, kHalf},
          {TYPE_ID_INT32, kInt},
          {TYPE_ID_UINT32, kUInt},
          {TYPE_ID_INT64, kInt64},
          {TYPE_ID_UINT64, kUInt64},
          {TYPE_ID_INT2, kInt2},
          {TYPE_ID_INT3, kInt3},
          {TYPE_ID_INT4, kInt4},
          {TYPE_ID_UINT2, kUInt2},
          {TYPE_ID_UINT3, kUInt3},
          {TYPE_ID_UINT4, kUInt4},
          {TYPE_ID_HALF2, kHalf2},
          {TYPE_ID_HALF3, kHalf3},
          {TYPE_ID_HALF4, kHalf4},
          {TYPE_ID_MATRIX2D, kMatrix2d},
          {TYPE_ID_MATRIX3D, kMatrix3d},
          {TYPE_ID_MATRIX4D, kMatrix4d},
          {TYPE_ID_FLOAT, kFloat},
          {TYPE_ID_FLOAT2, kFloat2},
          {TYPE_ID_FLOAT3, kFloat3},
          {TYPE_ID_FLOAT4, kFloat4},
          {TYPE_ID_DOUBLE, kDouble},
          {TYPE_ID_DOUBLE2, kDouble2},
          {TYPE_ID_DOUBLE3, kDouble3},
          {TYPE_ID_DOUBLE4, kDouble4},
          {TYPE_ID_QUATH, kQuath},
          {TYPE_ID_QUATF, kQuatf},
          {TYPE_ID_QUATD, kQuatd},
          {TYPE_ID_VECTOR3H, kVector3h},
          {TYPE_ID_VECTOR3F, kVector3f},
          {TYPE_ID_VECTOR3D, kVector3d},
          {TYPE_ID_POINT3H, kPoint3h},
          {TYPE_ID_POINT3F, kPoint3f},
          {TYPE_ID_POINT3D, kPoint3d},
          {TYPE_ID_NORMAL3H, kNormal3h},
          {TYPE_ID_NORMAL3F, kNormal3f},
          {TYPE_ID_NORMAL3D, kNormal3d},
          {TYPE_ID_COLOR3F, kColor3f},
          {TYPE_ID_COLOR3D, kColor3d},
          {TYPE_ID_COLOR4F, kColor4f},
          {TYPE_ID_COLOR4D, kColor4d},
          {TYPE_ID_FRAME4D, kFrame4d},
          {TYPE_ID_TEXCOORD2H, kTexCoord2h},
          {TYPE_ID_TEXCOORD2F, kTexCoord2f},
          {TYPE_ID_TEXCOORD2D, kTexCoord2d},
          {TYPE_ID_TEXCOORD3H, kTexCoord3h},
          {TYPE_ID_TEXCOORD3F, kTexCoord3f},
          {TYPE_ID_TEXCOORD3D, kTexCoord3d},
          {TYPE_ID_RELATIONSHIP, kRelationship},
      });

  bool array_bit = (TYPE_ID_1D_ARRAY_BIT & tyid);
  uint32_t scalar_tid = tyid & (~TYPE_ID_1D_ARRAY_BIT);

  auto ret = tynamemap.find(scalar_tid);
  if (ret != tynamemap.end()) {
    std::string s = ret->second.c_str();
    if (array_bit) {
      s += "[]";
    }
    return std::move(s);
  }

  return nonstd::nullopt;
}